

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

SyString * VmHttpExtractHeaderValue(SySet *pSet,char *zMime,sxu32 nByte)

{
  int iVar1;
  SyString *pSVar2;
  ulong uVar3;
  
  uVar3 = (ulong)pSet->nUsed;
  if (uVar3 != 0) {
    pSVar2 = (SyString *)((long)pSet->pBase + 0x10);
    do {
      iVar1 = nByte - pSVar2[-1].nByte;
      if (iVar1 == 0) {
        iVar1 = SyStrnicmp(zMime,pSVar2[-1].zString,pSVar2[-1].nByte);
      }
      if (iVar1 == 0) {
        return pSVar2;
      }
      pSVar2 = pSVar2 + 2;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return (SyString *)0x0;
}

Assistant:

static SyString * VmHttpExtractHeaderValue(SySet *pSet, const char *zMime, sxu32 nByte)
 {
	 SyhttpHeader *aMime, *pMime;
	 SyString sMime;
	 sxu32 n;
	 SyStringInitFromBuf(&sMime, zMime, nByte);
	 /* Point to the MIME entries */
	 aMime = (SyhttpHeader *)SySetBasePtr(pSet);
	 /* Perform the lookup */
	 for( n = 0 ; n < SySetUsed(pSet) ; ++n ){
		 pMime = &aMime[n];
		 if( SyStringCmp(&sMime, &pMime->sName, SyStrnicmp) == 0 ){
			 /* Header found, return it's associated value */
			 return &pMime->sValue;
		 }
	 }
	 /* No such MIME header */
	 return 0;
 }